

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,transaction_identifier<false>,unsigned_int>
               (ParamsStream<DataStream_&,_TransactionSerParams> *s,
               transaction_identifier<false> *args,uint *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256u>::Serialize<ParamsStream<DataStream&,TransactionSerParams>>
            ((base_blob<256u> *)args,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata32<ParamsStream<DataStream&,TransactionSerParams>>(s,*args_1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}